

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O1

void duckdb::IntervalAverageOperation::Finalize<duckdb::interval_t,duckdb::IntervalAvgState>
               (IntervalAvgState *state,interval_t *target,AggregateFinalizeData *finalize_data)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long count;
  
  lVar3 = state->count;
  if (lVar3 != 0) {
    target->months = (int32_t)((long)(state->value).months / lVar3);
    iVar1 = (state->value).months;
    iVar7 = (int)((long)(state->value).days / lVar3);
    target->days = iVar7;
    iVar2 = (state->value).days;
    lVar6 = (state->value).micros / lVar3;
    target->micros = lVar6;
    lVar4 = (state->value).micros;
    lVar5 = ((long)iVar1 % lVar3) * 0x1e;
    target->days = (int)(lVar5 / lVar3) + iVar7;
    target->micros =
         lVar4 % lVar3 + lVar6 + (((long)iVar2 % lVar3 + lVar5 % lVar3) * 86400000000) / lVar3;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			// DivideOperator does not borrow fractions right,
			// TODO: Maybe it should?
			// Copy PG implementation.
			const auto &value = state.value;
			const auto count = UnsafeNumericCast<int64_t>(state.count);

			target.months = value.months / count;
			auto months_remainder = value.months % count;

			target.days = value.days / count;
			auto days_remainder = value.days % count;

			target.micros = value.micros / count;
			auto micros_remainder = value.micros % count;

			//	Shift the remainders right
			months_remainder *= Interval::DAYS_PER_MONTH;
			target.days += months_remainder / count;
			days_remainder += months_remainder % count;

			days_remainder *= Interval::MICROS_PER_DAY;
			micros_remainder += days_remainder / count;
			target.micros += micros_remainder;
		}
	}